

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int unixShmLock(sqlite3_file *fd,int ofst,int n,int flags)

{
  ushort *puVar1;
  int *piVar2;
  uint uVar3;
  sqlite3_io_methods *psVar4;
  long lVar5;
  int iVar6;
  bool bVar7;
  ushort uVar8;
  int iVar9;
  ushort uVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  ushort uVar14;
  uint uVar15;
  uint uVar16;
  
  psVar4 = fd[8].pMethods;
  if (psVar4 == (sqlite3_io_methods *)0x0) {
    return 0x140a;
  }
  lVar5 = *(long *)psVar4;
  if (lVar5 == 0) {
    return 0x140a;
  }
  iVar11 = n + ofst;
  uVar16 = 1 << ((byte)ofst & 0x1f);
  if (*(sqlite3_mutex **)(lVar5 + 8) != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(*(sqlite3_mutex **)(lVar5 + 8));
  }
  lVar13 = lVar5 + 0x40;
  uVar15 = (1 << ((byte)iVar11 & 0x1f)) - uVar16;
  uVar14 = (ushort)uVar15;
  if ((flags & 1U) == 0) {
    if ((flags & 4U) == 0) {
      if (0 < n) {
        lVar12 = (long)ofst;
        do {
          if (((*(ushort *)((long)&psVar4->xRead + 4) >> ((uint)lVar12 & 0x1f) & 1) == 0) &&
             (*(int *)(lVar13 + lVar12 * 4) != 0)) goto LAB_00127cfa;
          lVar12 = lVar12 + 1;
        } while (lVar12 < iVar11);
      }
      uVar16 = *(uint *)((fd[2].pMethods)->xLock + 0x18);
      if (((int)uVar16 < 0) || (iVar9 = (*aSyscall[7].pCurrent)((ulong)uVar16,6), iVar9 != -1)) {
        puVar1 = (ushort *)((long)&psVar4->xRead + 4);
        *puVar1 = *puVar1 | uVar14;
        iVar9 = 0;
        if (0 < n) {
          iVar6 = ofst + 1;
          if (ofst + 1 < iVar11) {
            iVar6 = iVar11;
          }
          memset((void *)(lVar5 + (long)ofst * 4 + 0x40),0xff,(ulong)(uint)(~ofst + iVar6) * 4 + 4);
        }
      }
      else {
        iVar9 = 5;
      }
      goto LAB_00127d04;
    }
    uVar8 = *(ushort *)((long)&psVar4->xRead + 2);
    iVar9 = 0;
    if ((uVar15 & uVar8) != 0) goto LAB_00127d04;
    lVar12 = (long)ofst;
    iVar11 = *(int *)(lVar13 + lVar12 * 4);
    if (-1 < iVar11) {
      if (iVar11 == 0) {
        uVar16 = *(uint *)((fd[2].pMethods)->xLock + 0x18);
        if ((int)uVar16 < 0) {
          iVar11 = 0;
        }
        else {
          iVar11 = (*aSyscall[7].pCurrent)((ulong)uVar16,6);
          if (iVar11 == -1) goto LAB_00127cfa;
          uVar8 = *(ushort *)((long)&psVar4->xRead + 2);
          iVar11 = *(int *)(lVar13 + lVar12 * 4);
        }
      }
      *(ushort *)((long)&psVar4->xRead + 2) = uVar8 | uVar14;
      *(int *)(lVar13 + lVar12 * 4) = iVar11 + 1;
      goto LAB_00127d04;
    }
LAB_00127cfa:
    iVar9 = 5;
  }
  else {
    uVar3 = *(uint *)((long)&psVar4->xRead + 4);
    uVar10 = (ushort)uVar3;
    uVar8 = *(ushort *)((long)&psVar4->xRead + 2);
    iVar9 = 0;
    if (((uVar8 | uVar3) & uVar15 & 0xffff) == 0) goto LAB_00127d04;
    if (n < 1) {
LAB_00127bd8:
      if ((-1 < *(int *)((fd[2].pMethods)->xLock + 0x18)) &&
         (iVar11 = (*aSyscall[7].pCurrent)(), iVar11 == -1)) goto LAB_00127cfa;
      memset((void *)(lVar13 + (long)ofst * 4),0,(long)n << 2);
      uVar8 = *(ushort *)((long)&psVar4->xRead + 2);
      uVar10 = *(ushort *)((long)&psVar4->xRead + 4);
    }
    else {
      bVar7 = true;
      lVar12 = (long)ofst;
      do {
        if ((int)(uint)((uVar8 >> ((uint)lVar12 & 0x1f) & 1) != 0) < *(int *)(lVar13 + lVar12 * 4))
        {
          bVar7 = false;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < iVar11);
      if (bVar7) goto LAB_00127bd8;
      if ((uVar16 & uVar8) != 0) {
        piVar2 = (int *)(lVar13 + (long)ofst * 4);
        *piVar2 = *piVar2 + -1;
      }
    }
    iVar9 = 0;
    *(ushort *)((long)&psVar4->xRead + 4) = uVar10 & ~uVar14;
    *(ushort *)((long)&psVar4->xRead + 2) = uVar8 & ~uVar14;
  }
LAB_00127d04:
  if (*(sqlite3_mutex **)(lVar5 + 8) != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(*(sqlite3_mutex **)(lVar5 + 8));
  }
  return iVar9;
}

Assistant:

static int unixShmLock(
  sqlite3_file *fd,          /* Database file holding the shared memory */
  int ofst,                  /* First lock to acquire or release */
  int n,                     /* Number of locks to acquire or release */
  int flags                  /* What to do with the lock */
){
  unixFile *pDbFd = (unixFile*)fd;      /* Connection holding shared memory */
  unixShm *p;                           /* The shared memory being locked */
  unixShmNode *pShmNode;                /* The underlying file iNode */
  int rc = SQLITE_OK;                   /* Result code */
  u16 mask;                             /* Mask of locks to take or release */
  int *aLock;

  p = pDbFd->pShm;
  if( p==0 ) return SQLITE_IOERR_SHMLOCK;
  pShmNode = p->pShmNode;
  if( NEVER(pShmNode==0) ) return SQLITE_IOERR_SHMLOCK;
  aLock = pShmNode->aLock;

  assert( pShmNode==pDbFd->pInode->pShmNode );
  assert( pShmNode->pInode==pDbFd->pInode );
  assert( ofst>=0 && ofst+n<=SQLITE_SHM_NLOCK );
  assert( n>=1 );
  assert( flags==(SQLITE_SHM_LOCK | SQLITE_SHM_SHARED)
       || flags==(SQLITE_SHM_LOCK | SQLITE_SHM_EXCLUSIVE)
       || flags==(SQLITE_SHM_UNLOCK | SQLITE_SHM_SHARED)
       || flags==(SQLITE_SHM_UNLOCK | SQLITE_SHM_EXCLUSIVE) );
  assert( n==1 || (flags & SQLITE_SHM_EXCLUSIVE)!=0 );
  assert( pShmNode->hShm>=0 || pDbFd->pInode->bProcessLock==1 );
  assert( pShmNode->hShm<0 || pDbFd->pInode->bProcessLock==0 );

  /* Check that, if this to be a blocking lock, no locks that occur later
  ** in the following list than the lock being obtained are already held:
  **
  **   1. Checkpointer lock (ofst==1).
  **   2. Write lock (ofst==0).
  **   3. Read locks (ofst>=3 && ofst<SQLITE_SHM_NLOCK).
  **
  ** In other words, if this is a blocking lock, none of the locks that
  ** occur later in the above list than the lock being obtained may be
  ** held.
  **
  ** It is not permitted to block on the RECOVER lock.
  */
#ifdef SQLITE_ENABLE_SETLK_TIMEOUT
  assert( (flags & SQLITE_SHM_UNLOCK) || pDbFd->iBusyTimeout==0 || (
         (ofst!=2)                                   /* not RECOVER */
      && (ofst!=1 || (p->exclMask|p->sharedMask)==0)
      && (ofst!=0 || (p->exclMask|p->sharedMask)<3)
      && (ofst<3  || (p->exclMask|p->sharedMask)<(1<<ofst))
  ));
#endif

  mask = (1<<(ofst+n)) - (1<<ofst);
  assert( n>1 || mask==(1<<ofst) );
  sqlite3_mutex_enter(pShmNode->pShmMutex);
  assert( assertLockingArrayOk(pShmNode) );
  if( flags & SQLITE_SHM_UNLOCK ){
    if( (p->exclMask|p->sharedMask) & mask ){
      int ii;
      int bUnlock = 1;

      for(ii=ofst; ii<ofst+n; ii++){
        if( aLock[ii]>((p->sharedMask & (1<<ii)) ? 1 : 0) ){
          bUnlock = 0;
        }
      }

      if( bUnlock ){
        rc = unixShmSystemLock(pDbFd, F_UNLCK, ofst+UNIX_SHM_BASE, n);
        if( rc==SQLITE_OK ){
          memset(&aLock[ofst], 0, sizeof(int)*n);
        }
      }else if( ALWAYS(p->sharedMask & (1<<ofst)) ){
        assert( n==1 && aLock[ofst]>1 );
        aLock[ofst]--;
      }

      /* Undo the local locks */
      if( rc==SQLITE_OK ){
        p->exclMask &= ~mask;
        p->sharedMask &= ~mask;
      }
    }
  }else if( flags & SQLITE_SHM_SHARED ){
    assert( n==1 );
    assert( (p->exclMask & (1<<ofst))==0 );
    if( (p->sharedMask & mask)==0 ){
      if( aLock[ofst]<0 ){
        rc = SQLITE_BUSY;
      }else if( aLock[ofst]==0 ){
        rc = unixShmSystemLock(pDbFd, F_RDLCK, ofst+UNIX_SHM_BASE, n);
      }

      /* Get the local shared locks */
      if( rc==SQLITE_OK ){
        p->sharedMask |= mask;
        aLock[ofst]++;
      }
    }
  }else{
    /* Make sure no sibling connections hold locks that will block this
    ** lock.  If any do, return SQLITE_BUSY right away.  */
    int ii;
    for(ii=ofst; ii<ofst+n; ii++){
      assert( (p->sharedMask & mask)==0 );
      if( ALWAYS((p->exclMask & (1<<ii))==0) && aLock[ii] ){
        rc = SQLITE_BUSY;
        break;
      }
    }

    /* Get the exclusive locks at the system level. Then if successful
    ** also update the in-memory values. */
    if( rc==SQLITE_OK ){
      rc = unixShmSystemLock(pDbFd, F_WRLCK, ofst+UNIX_SHM_BASE, n);
      if( rc==SQLITE_OK ){
        assert( (p->sharedMask & mask)==0 );
        p->exclMask |= mask;
        for(ii=ofst; ii<ofst+n; ii++){
          aLock[ii] = -1;
        }
      }
    }
  }
  assert( assertLockingArrayOk(pShmNode) );
  sqlite3_mutex_leave(pShmNode->pShmMutex);
  OSTRACE(("SHM-LOCK shmid-%d, pid-%d got %03x,%03x\n",
           p->id, osGetpid(0), p->sharedMask, p->exclMask));
  return rc;
}